

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O3

void cnn::GraphOptimize(ComputationGraph *cg)

{
  size_type *psVar1;
  ulong uVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  uint __val;
  pointer ppNVar4;
  pointer pVVar5;
  Node *pNVar6;
  bool bVar7;
  ComputationGraph *pCVar8;
  char cVar9;
  char cVar10;
  pointer ppNVar11;
  undefined8 *puVar12;
  ostream *poVar13;
  uint uVar14;
  long lVar15;
  int iVar16;
  pointer pVVar17;
  ulong uVar18;
  int weight;
  int iVar19;
  long lVar20;
  string __str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  x;
  vector<int,_std::allocator<int>_> longest_paths;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  ulong *local_b8;
  uint local_b0;
  undefined4 uStack_ac;
  ulong local_a8 [2];
  ulong *local_98;
  long local_90;
  ulong local_88 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  ComputationGraph *local_58;
  ulong local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  std::vector<int,_std::allocator<int>_>::vector
            (&local_48,
             (long)(cg->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)(cg->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl
                   .super__Vector_impl_data._M_start >> 3,(allocator_type *)&local_d8);
  ppNVar11 = (cg->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppNVar4 = (cg->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  lVar15 = (long)ppNVar4 - (long)ppNVar11;
  if (lVar15 != 0) {
    uVar18 = 0;
    do {
      pVVar17 = (ppNVar11[uVar18]->args).
                super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
                super__Vector_impl_data._M_start;
      pVVar5 = (ppNVar11[uVar18]->args).
               super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pVVar17 != pVVar5) {
        lVar20 = (long)pVVar5 - (long)pVVar17;
        iVar19 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar18];
        do {
          iVar16 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[pVVar17->t] + (uint)(lVar20 == 0x1c);
          if (iVar19 < iVar16) {
            local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar18] = iVar16;
            iVar19 = iVar16;
          }
          pVVar17 = pVVar17 + 1;
        } while (pVVar17 != pVVar5);
      }
      uVar18 = uVar18 + 1;
    } while ((uVar18 & 0xffffffff) < (ulong)(lVar15 >> 3));
    if (ppNVar4 != ppNVar11) {
      paVar3 = &local_d8.field_2;
      uVar18 = 0;
      local_58 = cg;
      do {
        local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pVVar5 = (ppNVar11[uVar18]->args).
                 super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        local_50 = uVar18;
        for (pVVar17 = (ppNVar11[uVar18]->args).
                       super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
                       _M_impl.super__Vector_impl_data._M_start; pVVar17 != pVVar5;
            pVVar17 = pVVar17 + 1) {
          __val = pVVar17->t;
          local_98 = local_88;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"x","");
          cVar10 = '\x01';
          if (9 < __val) {
            uVar14 = __val;
            cVar9 = '\x04';
            do {
              cVar10 = cVar9;
              if (uVar14 < 100) {
                cVar10 = cVar10 + -2;
                goto LAB_0019461a;
              }
              if (uVar14 < 1000) {
                cVar10 = cVar10 + -1;
                goto LAB_0019461a;
              }
              if (uVar14 < 10000) goto LAB_0019461a;
              bVar7 = 99999 < uVar14;
              uVar14 = uVar14 / 10000;
              cVar9 = cVar10 + '\x04';
            } while (bVar7);
            cVar10 = cVar10 + '\x01';
          }
LAB_0019461a:
          local_b8 = local_a8;
          std::__cxx11::string::_M_construct((ulong)&local_b8,cVar10);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_b8,local_b0,__val);
          uVar18 = 0xf;
          if (local_98 != local_88) {
            uVar18 = local_88[0];
          }
          uVar2 = CONCAT44(uStack_ac,local_b0) + local_90;
          if (uVar18 < uVar2) {
            uVar18 = 0xf;
            if (local_b8 != local_a8) {
              uVar18 = local_a8[0];
            }
            if (uVar18 < uVar2) goto LAB_00194688;
            puVar12 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_98);
          }
          else {
LAB_00194688:
            puVar12 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_b8);
          }
          psVar1 = puVar12 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar1) {
            local_d8.field_2._M_allocated_capacity = *psVar1;
            local_d8.field_2._8_8_ = puVar12[3];
            local_d8._M_dataplus._M_p = (pointer)paVar3;
          }
          else {
            local_d8.field_2._M_allocated_capacity = *psVar1;
            local_d8._M_dataplus._M_p = (pointer)*puVar12;
          }
          local_d8._M_string_length = puVar12[1];
          *puVar12 = psVar1;
          puVar12[1] = 0;
          *(undefined1 *)psVar1 = 0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
                     &local_d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != paVar3) {
            operator_delete(local_d8._M_dataplus._M_p);
          }
          if (local_b8 != local_a8) {
            operator_delete(local_b8);
          }
          if (local_98 != local_88) {
            operator_delete(local_98);
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"LONGEST PATH: ",0xe);
        uVar18 = local_50;
        poVar13 = (ostream *)
                  std::ostream::operator<<
                            (&std::cerr,
                             local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[local_50]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\tx",2);
        poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13," = ",3);
        pCVar8 = local_58;
        pNVar6 = (local_58->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar18];
        (*pNVar6->_vptr_Node[3])(&local_d8,pNVar6,&local_78);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,local_d8._M_dataplus._M_p,local_d8._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != paVar3) {
          operator_delete(local_d8._M_dataplus._M_p);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_78);
        uVar18 = (ulong)((int)uVar18 + 1);
        ppNVar11 = (pCVar8->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
      } while (uVar18 < (ulong)((long)(pCVar8->nodes).
                                      super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                                      _M_impl.super__Vector_impl_data._M_finish - (long)ppNVar11 >>
                               3));
    }
  }
  abort();
}

Assistant:

void GraphOptimize(ComputationGraph* cg) {
  // topo sort
  vector<Node*>& nodes = cg->nodes;
  vector<int> longest_paths(nodes.size());
  for (unsigned i = 0; i < nodes.size(); ++i) {
    auto& v = *nodes[i];  // vertex v_i
    auto& lp = longest_paths[i]; // distance to v_i
    for (auto e : v.args) {
      int weight = 0;
      if (v.args.size() == 7) weight = 1;
      int pte = longest_paths[e] + weight;
      if (pte > lp) lp = pte;
    }
  }
  for (unsigned i = 0; i < nodes.size(); ++i) {
    vector<string> x;
    for (auto e : nodes[i]->args) {
      x.push_back(string("x") + to_string(e));
    }
    cerr << "LONGEST PATH: " << longest_paths[i] << "\tx" << i << " = " << nodes[i]->as_string(x) << endl;
  }
  abort();// DEBUGGING
}